

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O0

void __thiscall
duckdb::BaseAppender::AppendValueInternal<duckdb::interval_t>(BaseAppender *this,interval_t input)

{
  interval_t value;
  interval_t input_00;
  interval_t input_01;
  interval_t input_02;
  interval_t input_03;
  interval_t input_04;
  interval_t input_05;
  interval_t input_06;
  interval_t input_07;
  interval_t input_08;
  interval_t input_09;
  interval_t input_10;
  interval_t input_11;
  interval_t input_12;
  interval_t input_13;
  interval_t input_14;
  interval_t input_15;
  interval_t input_16;
  interval_t input_17;
  interval_t input_18;
  interval_t input_19;
  interval_t input_20;
  interval_t input_21;
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *this_00;
  size_type sVar3;
  undefined8 uVar4;
  LogicalType *pLVar5;
  string_t *psVar6;
  idx_t iVar7;
  BaseAppender *this_01;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  string_t sVar8;
  value_type *col;
  BaseAppender *in_stack_fffffffffffffd58;
  Value *in_stack_fffffffffffffd60;
  Value *in_stack_fffffffffffffd68;
  BaseAppender *in_stack_fffffffffffffd70;
  allocator *paVar9;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  Vector *in_stack_fffffffffffffd88;
  BaseAppender *in_stack_fffffffffffffd90;
  ulong uVar10;
  Vector *in_stack_fffffffffffffdd0;
  interval_t in_stack_fffffffffffffdd8;
  Vector *local_1f0;
  BaseAppender *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  int64_t in_stack_fffffffffffffe30;
  allocator local_189;
  string local_188 [32];
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  reference local_58;
  undefined1 local_4d;
  allocator local_39;
  string local_38 [40];
  undefined8 local_10;
  undefined8 uStack_8;
  
  uVar10 = *(ulong *)(in_RDI + 0x88);
  local_10 = in_RSI;
  uStack_8 = in_RDX;
  this_00 = &GetActiveTypes(in_stack_fffffffffffffd58)->
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
  sVar3 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size(this_00);
  if (sVar3 <= uVar10) {
    local_4d = 1;
    uVar4 = __cxa_allocate_exception(0x10);
    paVar9 = &local_39;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_38,"Too many appends for chunk!",paVar9);
    InvalidInputException::InvalidInputException
              ((InvalidInputException *)in_stack_fffffffffffffd60,
               (string *)in_stack_fffffffffffffd58);
    local_4d = 0;
    __cxa_throw(uVar4,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException
               );
  }
  local_58 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffd60,
                        (size_type)in_stack_fffffffffffffd58);
  pLVar5 = Vector::GetType(local_58);
  LVar1 = LogicalType::id(pLVar5);
  this_01 = (BaseAppender *)(ulong)(byte)(LVar1 - BOOLEAN);
  switch(this_01) {
  case (BaseAppender *)0x0:
    local_68 = local_10;
    local_60 = uStack_8;
    input_00.micros = (int64_t)in_stack_fffffffffffffd90;
    input_00._0_8_ = in_stack_fffffffffffffd88;
    AppendValueInternal<duckdb::interval_t,bool>
              (this_01,(Vector *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               input_00);
    break;
  case (BaseAppender *)0x1:
    local_88 = local_10;
    local_80 = uStack_8;
    input_02.micros = (int64_t)in_stack_fffffffffffffd90;
    input_02._0_8_ = in_stack_fffffffffffffd88;
    AppendValueInternal<duckdb::interval_t,signed_char>
              (this_01,(Vector *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               input_02);
    break;
  case (BaseAppender *)0x2:
    local_a8 = local_10;
    local_a0 = uStack_8;
    input_04.micros = (int64_t)in_stack_fffffffffffffd90;
    input_04._0_8_ = in_stack_fffffffffffffd88;
    AppendValueInternal<duckdb::interval_t,short>
              (this_01,(Vector *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               input_04);
    break;
  case (BaseAppender *)0x3:
    local_c8 = local_10;
    local_c0 = uStack_8;
    input_06.micros = (int64_t)in_stack_fffffffffffffd90;
    input_06._0_8_ = in_stack_fffffffffffffd88;
    AppendValueInternal<duckdb::interval_t,int>
              (this_01,(Vector *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               input_06);
    break;
  case (BaseAppender *)0x4:
    local_e8 = local_10;
    local_e0 = uStack_8;
    input_08.micros = (int64_t)in_stack_fffffffffffffd90;
    input_08._0_8_ = in_stack_fffffffffffffd88;
    AppendValueInternal<duckdb::interval_t,long>
              (this_01,(Vector *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               input_08);
    break;
  case (BaseAppender *)0x5:
    input_11.micros = (int64_t)in_stack_fffffffffffffd90;
    input_11._0_8_ = in_stack_fffffffffffffd88;
    AppendValueInternal<duckdb::interval_t,duckdb::date_t>
              (this_01,(Vector *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               input_11);
    break;
  case (BaseAppender *)0x6:
    input_13.micros = (int64_t)in_stack_fffffffffffffd90;
    input_13._0_8_ = in_stack_fffffffffffffd88;
    AppendValueInternal<duckdb::interval_t,duckdb::dtime_t>
              (this_01,(Vector *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               input_13);
    break;
  default:
    value.micros._0_7_ = in_stack_fffffffffffffd78;
    value._0_8_ = in_stack_fffffffffffffd70;
    value.micros._7_1_ = in_stack_fffffffffffffd7f;
    Value::CreateValue<duckdb::interval_t>(value);
    AppendValue(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    Value::~Value(in_stack_fffffffffffffd60);
    return;
  case (BaseAppender *)0x9:
  case (BaseAppender *)0x16:
    input_12.micros = (int64_t)in_stack_fffffffffffffd90;
    input_12._0_8_ = in_stack_fffffffffffffd88;
    AppendValueInternal<duckdb::interval_t,duckdb::timestamp_t>
              (this_01,(Vector *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               input_12);
    break;
  case (BaseAppender *)0xb:
    pLVar5 = Vector::GetType(local_58);
    PVar2 = LogicalType::InternalType(pLVar5);
    if (PVar2 == INT128) {
      local_168 = local_10;
      local_160 = uStack_8;
      input_21.micros = in_stack_fffffffffffffe30;
      input_21.months = (int)in_stack_fffffffffffffe28;
      input_21.days = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
      AppendDecimalValueInternal<duckdb::interval_t,duckdb::hugeint_t>
                (in_stack_fffffffffffffe20,local_1f0,input_21);
    }
    else if (PVar2 == INT16) {
      local_138 = local_10;
      local_130 = uStack_8;
      input_18.micros = in_stack_fffffffffffffe30;
      input_18.months = (int)in_stack_fffffffffffffe28;
      input_18.days = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
      AppendDecimalValueInternal<duckdb::interval_t,short>
                (in_stack_fffffffffffffe20,local_1f0,input_18);
    }
    else if (PVar2 == INT32) {
      local_148 = local_10;
      local_140 = uStack_8;
      input_19.micros = in_stack_fffffffffffffe30;
      input_19.months = (int)in_stack_fffffffffffffe28;
      input_19.days = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
      AppendDecimalValueInternal<duckdb::interval_t,int>
                (in_stack_fffffffffffffe20,local_1f0,input_19);
    }
    else {
      if (PVar2 != INT64) {
        uVar4 = __cxa_allocate_exception(0x10);
        paVar9 = &local_189;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_188,"Internal type not recognized for Decimal",paVar9);
        InternalException::InternalException
                  ((InternalException *)in_stack_fffffffffffffd60,
                   (string *)in_stack_fffffffffffffd58);
        __cxa_throw(uVar4,&InternalException::typeinfo,InternalException::~InternalException);
      }
      local_158 = local_10;
      local_150 = uStack_8;
      input_20.micros = in_stack_fffffffffffffe30;
      input_20.months = (int)in_stack_fffffffffffffe28;
      input_20.days = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
      AppendDecimalValueInternal<duckdb::interval_t,long>
                (in_stack_fffffffffffffe20,local_1f0,input_20);
    }
    break;
  case (BaseAppender *)0xc:
    local_118 = local_10;
    local_110 = uStack_8;
    input_09.micros = (int64_t)in_stack_fffffffffffffd90;
    input_09._0_8_ = in_stack_fffffffffffffd88;
    AppendValueInternal<duckdb::interval_t,float>
              (this_01,(Vector *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               input_09);
    break;
  case (BaseAppender *)0xd:
    local_128 = local_10;
    local_120 = uStack_8;
    input_10.micros = (int64_t)in_stack_fffffffffffffd90;
    input_10._0_8_ = in_stack_fffffffffffffd88;
    AppendValueInternal<duckdb::interval_t,double>
              (this_01,(Vector *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               input_10);
    break;
  case (BaseAppender *)0xf:
    sVar8 = StringCast::Operation<duckdb::interval_t>
                      (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    psVar6 = FlatVector::GetData<duckdb::string_t>((Vector *)0x90cd5d);
    iVar7 = DataChunk::size((DataChunk *)(in_RDI + 0x48));
    local_1f0 = sVar8.value._0_8_;
    *(Vector **)&psVar6[iVar7].value = local_1f0;
    psVar6[iVar7].value.pointer.ptr = sVar8.value._8_8_;
    break;
  case (BaseAppender *)0x11:
    input_17.micros = uVar10;
    input_17.months = (int)in_RDI;
    input_17.days = (int)((ulong)in_RDI >> 0x20);
    AppendValueInternal<duckdb::interval_t,duckdb::interval_t>
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,input_17);
    break;
  case (BaseAppender *)0x12:
    local_78 = local_10;
    local_70 = uStack_8;
    input_01.micros = (int64_t)in_stack_fffffffffffffd90;
    input_01._0_8_ = in_stack_fffffffffffffd88;
    AppendValueInternal<duckdb::interval_t,unsigned_char>
              (this_01,(Vector *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               input_01);
    break;
  case (BaseAppender *)0x13:
    local_98 = local_10;
    local_90 = uStack_8;
    input_03.micros = (int64_t)in_stack_fffffffffffffd90;
    input_03._0_8_ = in_stack_fffffffffffffd88;
    AppendValueInternal<duckdb::interval_t,unsigned_short>
              (this_01,(Vector *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               input_03);
    break;
  case (BaseAppender *)0x14:
    local_b8 = local_10;
    local_b0 = uStack_8;
    input_05.micros = (int64_t)in_stack_fffffffffffffd90;
    input_05._0_8_ = in_stack_fffffffffffffd88;
    AppendValueInternal<duckdb::interval_t,unsigned_int>
              (this_01,(Vector *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               input_05);
    break;
  case (BaseAppender *)0x15:
    local_d8 = local_10;
    local_d0 = uStack_8;
    input_07.micros = (int64_t)in_stack_fffffffffffffd90;
    input_07._0_8_ = in_stack_fffffffffffffd88;
    AppendValueInternal<duckdb::interval_t,unsigned_long>
              (this_01,(Vector *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               input_07);
    break;
  case (BaseAppender *)0x18:
    input_14.micros = (int64_t)in_stack_fffffffffffffd90;
    input_14._0_8_ = in_stack_fffffffffffffd88;
    AppendValueInternal<duckdb::interval_t,duckdb::dtime_tz_t>
              (this_01,(Vector *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               input_14);
    break;
  case (BaseAppender *)0x27:
    local_108 = local_10;
    local_100 = uStack_8;
    input_16.micros = uVar10;
    input_16.months = (int)in_RDI;
    input_16.days = (int)((ulong)in_RDI >> 0x20);
    AppendValueInternal<duckdb::interval_t,duckdb::uhugeint_t>
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,input_16);
    break;
  case (BaseAppender *)0x28:
    local_f8 = local_10;
    local_f0 = uStack_8;
    input_15.micros = uVar10;
    input_15.months = (int)in_RDI;
    input_15.days = (int)((ulong)in_RDI >> 0x20);
    AppendValueInternal<duckdb::interval_t,duckdb::hugeint_t>
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,input_15);
  }
  *(long *)(in_RDI + 0x88) = *(long *)(in_RDI + 0x88) + 1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(T input) {
	if (column >= GetActiveTypes().size()) {
		throw InvalidInputException("Too many appends for chunk!");
	}
	auto &col = chunk.data[column];
	switch (col.GetType().id()) {
	case LogicalTypeId::BOOLEAN:
		AppendValueInternal<T, bool>(col, input);
		break;
	case LogicalTypeId::UTINYINT:
		AppendValueInternal<T, uint8_t>(col, input);
		break;
	case LogicalTypeId::TINYINT:
		AppendValueInternal<T, int8_t>(col, input);
		break;
	case LogicalTypeId::USMALLINT:
		AppendValueInternal<T, uint16_t>(col, input);
		break;
	case LogicalTypeId::SMALLINT:
		AppendValueInternal<T, int16_t>(col, input);
		break;
	case LogicalTypeId::UINTEGER:
		AppendValueInternal<T, uint32_t>(col, input);
		break;
	case LogicalTypeId::INTEGER:
		AppendValueInternal<T, int32_t>(col, input);
		break;
	case LogicalTypeId::UBIGINT:
		AppendValueInternal<T, uint64_t>(col, input);
		break;
	case LogicalTypeId::BIGINT:
		AppendValueInternal<T, int64_t>(col, input);
		break;
	case LogicalTypeId::HUGEINT:
		AppendValueInternal<T, hugeint_t>(col, input);
		break;
	case LogicalTypeId::UHUGEINT:
		AppendValueInternal<T, uhugeint_t>(col, input);
		break;
	case LogicalTypeId::FLOAT:
		AppendValueInternal<T, float>(col, input);
		break;
	case LogicalTypeId::DOUBLE:
		AppendValueInternal<T, double>(col, input);
		break;
	case LogicalTypeId::DECIMAL:
		switch (col.GetType().InternalType()) {
		case PhysicalType::INT16:
			AppendDecimalValueInternal<T, int16_t>(col, input);
			break;
		case PhysicalType::INT32:
			AppendDecimalValueInternal<T, int32_t>(col, input);
			break;
		case PhysicalType::INT64:
			AppendDecimalValueInternal<T, int64_t>(col, input);
			break;
		case PhysicalType::INT128:
			AppendDecimalValueInternal<T, hugeint_t>(col, input);
			break;
		default:
			throw InternalException("Internal type not recognized for Decimal");
		}
		break;
	case LogicalTypeId::DATE:
		AppendValueInternal<T, date_t>(col, input);
		break;
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ:
		AppendValueInternal<T, timestamp_t>(col, input);
		break;
	case LogicalTypeId::TIME:
		AppendValueInternal<T, dtime_t>(col, input);
		break;
	case LogicalTypeId::TIME_TZ:
		AppendValueInternal<T, dtime_tz_t>(col, input);
		break;
	case LogicalTypeId::INTERVAL:
		AppendValueInternal<T, interval_t>(col, input);
		break;
	case LogicalTypeId::VARCHAR:
		FlatVector::GetData<string_t>(col)[chunk.size()] = StringCast::Operation<T>(input, col);
		break;
	default:
		AppendValue(Value::CreateValue<T>(input));
		return;
	}
	column++;
}